

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::InsertFunctionInfoCheck
          (Lowerer *this,RegOpnd *funcOpnd,Instr *insertBeforeInstr,AddrOpnd *inlinedFuncInfo,
          BailOutKind bailOutKind,BailOutInfo *bailOutInfo)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  BailOutInstrTemplate<IR::Instr> *instr;
  IndirOpnd *this_00;
  undefined4 *puVar5;
  
  instr = IR::BailOutInstrTemplate<IR::Instr>::New
                    (BailOnNotEqual,bailOutKind,bailOutInfo,bailOutInfo->bailOutFunc);
  this_00 = IR::IndirOpnd::New(funcOpnd,0x28,TyUint64,insertBeforeInstr->m_func,false);
  if ((instr->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3273;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((this_00->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_005e3273;
    *puVar5 = 0;
  }
  bVar4 = (this_00->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    this_00 = (IndirOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar1);
    bVar4 = (this_00->super_Opnd).field_0xb;
  }
  (this_00->super_Opnd).field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src1 = &this_00->super_Opnd;
  if ((instr->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_005e3273;
    *puVar5 = 0;
  }
  pFVar1 = (instr->super_Instr).m_func;
  if ((inlinedFuncInfo->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_005e3273:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = (inlinedFuncInfo->super_Opnd).field_0xb;
  if ((bVar4 & 2) != 0) {
    inlinedFuncInfo = (AddrOpnd *)IR::Opnd::Copy(&inlinedFuncInfo->super_Opnd,pFVar1);
    bVar4 = (inlinedFuncInfo->super_Opnd).field_0xb;
  }
  (inlinedFuncInfo->super_Opnd).field_0xb = bVar4 | 2;
  (instr->super_Instr).m_src2 = &inlinedFuncInfo->super_Opnd;
  IR::Instr::InsertBefore(insertBeforeInstr,&instr->super_Instr);
  return &instr->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::InsertFunctionInfoCheck(IR::RegOpnd * funcOpnd, IR::Instr *insertBeforeInstr, IR::AddrOpnd* inlinedFuncInfo, IR::BailOutKind bailOutKind, BailOutInfo *bailOutInfo)
{
    IR::Instr *bailOutIfWrongFuncInfo = IR::BailOutInstr::New(Js::OpCode::BailOnNotEqual, bailOutKind, bailOutInfo, bailOutInfo->bailOutFunc);

    // if (VarTo<JavascriptFunction>(r1)->functionInfo != funcInfo) goto noInlineLabel
    // BrNeq_A noInlineLabel, r1->functionInfo, funcInfo
    IR::IndirOpnd* opndFuncInfo = IR::IndirOpnd::New(funcOpnd, Js::JavascriptFunction::GetOffsetOfFunctionInfo(), TyMachPtr, insertBeforeInstr->m_func);
    bailOutIfWrongFuncInfo->SetSrc1(opndFuncInfo);
    bailOutIfWrongFuncInfo->SetSrc2(inlinedFuncInfo);

    insertBeforeInstr->InsertBefore(bailOutIfWrongFuncInfo);

    return bailOutIfWrongFuncInfo;
}